

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O2

void __thiscall soul::PoolAllocator::clear(PoolAllocator *this)

{
  std::
  vector<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>,_std::allocator<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>_>_>
  ::clear(&this->pools);
  std::
  vector<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>,_std::allocator<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>_>_>
  ::reserve(&this->pools,0x20);
  addNewPool(this);
  return;
}

Assistant:

void clear()
    {
        pools.clear();
        pools.reserve (32);
        addNewPool();
    }